

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRound.h
# Opt level: O0

void __thiscall
TimeRound<channel>::AddTimeRoundItemNode
          (TimeRound<channel> *this,SP_TimeRoundItemNode<channel> *time_round_item_node)

{
  Lock_Guard LVar1;
  Lock_Guard LVar2;
  element_type *peVar3;
  ostream *this_00;
  reference ppSVar4;
  SP_TimeRoundItemList<channel> *this_01;
  int new_index;
  int index;
  int local_28;
  int time;
  Lock_Guard lock;
  SP_TimeRoundItemNode<channel> *time_round_item_node_local;
  TimeRound<channel> *this_local;
  
  lock.Mutex = (pthread_mutex_t *)time_round_item_node;
  Lock_Guard::Lock_Guard((Lock_Guard *)&time,&this->Mutex);
  if (lock.Mutex != (pthread_mutex_t *)0x0) {
    peVar3 = std::
             __shared_ptr_access<TimeRoundItem<channel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TimeRoundItem<channel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)((long)lock.Mutex + 0x10));
    local_28 = TimeRoundItem<channel>::GetTimeThreod(peVar3);
    LVar1 = lock;
    if (local_28 < 1) {
      if (lock.Mutex != (pthread_mutex_t *)0x0) {
        SP_TimeRoundItemNode<channel>::~SP_TimeRoundItemNode
                  ((SP_TimeRoundItemNode<channel> *)lock.Mutex);
        operator_delete(LVar1.Mutex);
      }
    }
    else {
      if (this->max_time <= local_28) {
        this_00 = std::operator<<((ostream *)&std::cout,
                                  "TimeOut time is larger than the max_time of TimeRound,Set to the max_time-1"
                                 );
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        local_28 = this->max_time + -1;
      }
      new_index = (this->cur_index + local_28) % this->max_time;
      peVar3 = std::
               __shared_ptr_access<TimeRoundItem<channel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<TimeRoundItem<channel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)((long)lock.Mutex + 0x10));
      TimeRoundItem<channel>::SetIndex(peVar3,new_index);
      ppSVar4 = std::
                vector<SP_TimeRoundItemList<channel>_*,_std::allocator<SP_TimeRoundItemList<channel>_*>_>
                ::operator[](&this->TimeRoundVector,(long)new_index);
      if (*ppSVar4 == (value_type)0x0) {
        this_01 = (SP_TimeRoundItemList<channel> *)operator_new(0x10);
        SP_TimeRoundItemList<channel>::SP_TimeRoundItemList(this_01);
        ppSVar4 = std::
                  vector<SP_TimeRoundItemList<channel>_*,_std::allocator<SP_TimeRoundItemList<channel>_*>_>
                  ::operator[](&this->TimeRoundVector,(long)new_index);
        LVar1 = lock;
        *ppSVar4 = this_01;
        ppSVar4 = std::
                  vector<SP_TimeRoundItemList<channel>_*,_std::allocator<SP_TimeRoundItemList<channel>_*>_>
                  ::operator[](&this->TimeRoundVector,(long)new_index);
        LVar2 = lock;
        (*ppSVar4)->head = (SP_TimeRoundItemNode<channel> *)LVar1.Mutex;
        ppSVar4 = std::
                  vector<SP_TimeRoundItemList<channel>_*,_std::allocator<SP_TimeRoundItemList<channel>_*>_>
                  ::operator[](&this->TimeRoundVector,(long)new_index);
        (*ppSVar4)->tail = (SP_TimeRoundItemNode<channel> *)LVar2.Mutex;
      }
      else {
        ppSVar4 = std::
                  vector<SP_TimeRoundItemList<channel>_*,_std::allocator<SP_TimeRoundItemList<channel>_*>_>
                  ::operator[](&this->TimeRoundVector,(long)new_index);
        LVar1 = lock;
        if ((*ppSVar4)->head == (SP_TimeRoundItemNode<channel> *)0x0) {
          ppSVar4 = std::
                    vector<SP_TimeRoundItemList<channel>_*,_std::allocator<SP_TimeRoundItemList<channel>_*>_>
                    ::operator[](&this->TimeRoundVector,(long)new_index);
          LVar2 = lock;
          (*ppSVar4)->head = (SP_TimeRoundItemNode<channel> *)LVar1.Mutex;
          ppSVar4 = std::
                    vector<SP_TimeRoundItemList<channel>_*,_std::allocator<SP_TimeRoundItemList<channel>_*>_>
                    ::operator[](&this->TimeRoundVector,(long)new_index);
          (*ppSVar4)->tail = (SP_TimeRoundItemNode<channel> *)LVar2.Mutex;
        }
        else {
          ppSVar4 = std::
                    vector<SP_TimeRoundItemList<channel>_*,_std::allocator<SP_TimeRoundItemList<channel>_*>_>
                    ::operator[](&this->TimeRoundVector,(long)new_index);
          (*ppSVar4)->tail->next = (SP_TimeRoundItemNode<channel> *)LVar1.Mutex;
          ppSVar4 = std::
                    vector<SP_TimeRoundItemList<channel>_*,_std::allocator<SP_TimeRoundItemList<channel>_*>_>
                    ::operator[](&this->TimeRoundVector,(long)new_index);
          LVar1 = lock;
          *(SP_TimeRoundItemNode<channel> **)lock.Mutex = (*ppSVar4)->tail;
          ppSVar4 = std::
                    vector<SP_TimeRoundItemList<channel>_*,_std::allocator<SP_TimeRoundItemList<channel>_*>_>
                    ::operator[](&this->TimeRoundVector,(long)new_index);
          (*ppSVar4)->tail = (SP_TimeRoundItemNode<channel> *)LVar1.Mutex;
        }
      }
    }
  }
  Lock_Guard::~Lock_Guard((Lock_Guard *)&time);
  return;
}

Assistant:

void AddTimeRoundItemNode(SP_TimeRoundItemNode<T>* time_round_item_node)
        {
            Lock_Guard lock(Mutex);
            if(time_round_item_node == nullptr)
            {
                return;
            }
            int time = time_round_item_node->Item->GetTimeThreod();
            if(time <= 0)
            {
                delete time_round_item_node;
                return;
            }
            if(time >= max_time)
            {
                cout<<"TimeOut time is larger than the max_time of TimeRound,Set to the max_time-1"<<endl;
                time = max_time-1;
            }
            int index = (cur_index + time) % max_time;
            time_round_item_node->Item->SetIndex(index);

            if(TimeRoundVector[index] == nullptr)
            {
                TimeRoundVector[index] = new SP_TimeRoundItemList<T>();
                TimeRoundVector[index]->head = time_round_item_node;
                TimeRoundVector[index]->tail = time_round_item_node;
            }
            else
            {
                if(TimeRoundVector[index]->head != nullptr)
                {
                    TimeRoundVector[index]->tail->next = time_round_item_node;
                    time_round_item_node->pre = TimeRoundVector[index]->tail;
                    TimeRoundVector[index]->tail = time_round_item_node;
                }
                else
                {
                    TimeRoundVector[index]->head = time_round_item_node;
                    TimeRoundVector[index]->tail = time_round_item_node;
                }
            }
        }